

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_parse.c
# Opt level: O1

class_type parse_class_type(char *str)

{
  int iVar1;
  size_t i;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = class_types;
  lVar2 = 0;
  do {
    iVar1 = strcmp(str,*ppcVar3);
    if (iVar1 == 0) goto LAB_0010490c;
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (lVar2 != 0x18);
  lVar2 = 0x18;
LAB_0010490c:
  return (class_type)lVar2;
}

Assistant:

enum class_type parse_class_type(const char *str)
{
	enum class_type result = CLASS_LEC;
	size_t i;

	for (i = 0; class_types[i]; i++, result++) {
		if (!strcmp(str, class_types[i])) {
			return result;
		}
	}

	return CLASS_NONE;
}